

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnEnabled(int column_n,bool enabled)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  byte in_SIL;
  int in_EDI;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiContext *g;
  int local_4;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 != (ImGuiTable *)0x0) {
    local_4 = in_EDI;
    if (in_EDI < 0) {
      local_4 = pIVar1->CurrentColumn;
    }
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,local_4);
    pIVar2->IsUserEnabledNextFrame = (bool)(in_SIL & 1);
  }
  return;
}

Assistant:

void ImGui::TableSetColumnEnabled(int column_n, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);
    if (!table)
        return;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Hideable); // See comments above
    if (column_n < 0)
        column_n = table->CurrentColumn;
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column = &table->Columns[column_n];
    column->IsUserEnabledNextFrame = enabled;
}